

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_f32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 sampleCount;
  float *local_1058;
  drwav_uint64 samplesRead;
  uchar sampleData [4096];
  drwav *local_30;
  drwav_uint64 totalSamplesRead;
  float *pBufferOut_local;
  drwav_uint64 samplesToRead_local;
  drwav *pWav_local;
  
  if (pWav->bytesPerSample == 0) {
    pWav_local = (drwav *)0x0;
  }
  else {
    local_30 = (drwav *)0x0;
    totalSamplesRead = (drwav_uint64)pBufferOut;
    for (pBufferOut_local = (float *)samplesToRead; pBufferOut_local != (float *)0x0;
        pBufferOut_local = (float *)((long)pBufferOut_local - sampleCount)) {
      if (pBufferOut_local <
          SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT216(pWav->bytesPerSample),0)) {
        local_1058 = pBufferOut_local;
      }
      else {
        local_1058 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT216(pWav->bytesPerSample),0
                           );
      }
      sampleCount = drwav_read(pWav,(drwav_uint64)local_1058,&samplesRead);
      if (sampleCount == 0) break;
      drwav_mulaw_to_f32((float *)totalSamplesRead,(drwav_uint8 *)&samplesRead,sampleCount);
      totalSamplesRead = sampleCount * 4 + totalSamplesRead;
      local_30 = (drwav *)((local_30->fmt).subFormat + (sampleCount - 0x3c));
    }
    pWav_local = local_30;
  }
  return (drwav_uint64)pWav_local;
}

Assistant:

drwav_uint64 drwav_read_f32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_f32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}